

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl3.h
# Opt level: O0

nk_context * nk_glfw3_init(nk_glfw *glfw,GLFWwindow *win,nk_glfw_init_state init_state)

{
  nk_handle glfw_00;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  nk_vec2 nVar1;
  void *in_stack_ffffffffffffffb8;
  GLFWwindow *in_stack_ffffffffffffffc0;
  nk_user_font *in_stack_ffffffffffffffc8;
  undefined8 *puVar2;
  nk_context *in_stack_ffffffffffffffd0;
  
  glfwSetWindowUserPointer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *in_RDI = in_RSI;
  if (in_EDX == 1) {
    glfwSetScrollCallback
              ((GLFWwindow *)in_stack_ffffffffffffffc8,(GLFWscrollfun)in_stack_ffffffffffffffc0);
    glfwSetCharCallback((GLFWwindow *)in_stack_ffffffffffffffc8,
                        (GLFWcharfun)in_stack_ffffffffffffffc0);
    glfwSetMouseButtonCallback
              ((GLFWwindow *)in_stack_ffffffffffffffc8,(GLFWmousebuttonfun)in_stack_ffffffffffffffc0
              );
  }
  nk_init_default(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  in_RDI[0x407] = nk_glfw3_clipboard_copy;
  in_RDI[0x406] = nk_glfw3_clipboard_paste;
  puVar2 = in_RDI;
  glfw_00 = nk_handle_ptr(in_stack_ffffffffffffffb8);
  *(nk_handle *)(puVar2 + 0x405) = glfw_00;
  in_RDI[0x8ed] = 0;
  nk_glfw3_device_create((nk_glfw *)glfw_00.ptr);
  *(undefined4 *)(in_RDI + 0x8ee) = 0;
  puVar2 = in_RDI;
  nVar1 = nk_vec2(0.0,0.0);
  *(nk_vec2 *)((long)puVar2 + 0x4774) = nVar1;
  return (nk_context *)(in_RDI + 0x1a);
}

Assistant:

NK_API struct nk_context*
nk_glfw3_init(struct nk_glfw* glfw, GLFWwindow *win, enum nk_glfw_init_state init_state)
{
    glfwSetWindowUserPointer(win, glfw);
    glfw->win = win;
    if (init_state == NK_GLFW3_INSTALL_CALLBACKS) {
        glfwSetScrollCallback(win, nk_gflw3_scroll_callback);
        glfwSetCharCallback(win, nk_glfw3_char_callback);
        glfwSetMouseButtonCallback(win, nk_glfw3_mouse_button_callback);
    }
    nk_init_default(&glfw->ctx, 0);
    glfw->ctx.clip.copy = nk_glfw3_clipboard_copy;
    glfw->ctx.clip.paste = nk_glfw3_clipboard_paste;
    glfw->ctx.clip.userdata = nk_handle_ptr(0);
    glfw->last_button_click = 0;
    nk_glfw3_device_create(glfw);

    glfw->is_double_click_down = nk_false;
    glfw->double_click_pos = nk_vec2(0, 0);

    return &glfw->ctx;
}